

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall
CVmObjGramProd::add_alt
          (CVmObjGramProd *this,vm_obj_id_t self,CTcGramProdAlt *alt,vm_obj_id_t dict,
          vm_obj_id_t match)

{
  size_t sVar1;
  ulong uVar2;
  tctarg_prop_id_t tVar3;
  int iVar4;
  tcgram_tok_type tVar5;
  vm_gram_ext *pvVar6;
  int *piVar7;
  CTcSymObjBase *this_00;
  ulong uVar8;
  vmgram_undo_rec *this_01;
  int in_ECX;
  CTcGramProdAlt *in_RDX;
  CVmObjGramProd *in_RDI;
  int in_R8D;
  vmgram_undo_rec *rec;
  size_t i;
  vmgram_tok_info *ti;
  vmgram_alt_info *ai;
  int ntoks;
  CTcGramProdTok *tok;
  int idx;
  size_t in_stack_ffffffffffffff58;
  vmgram_tok_info *in_stack_ffffffffffffff60;
  vmgram_undo_rec *this_02;
  vmgram_alt_info *in_stack_ffffffffffffff68;
  vmgram_alt_info *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  vm_obj_id_t self_00;
  CVmUndo *in_stack_ffffffffffffff80;
  ulong local_60;
  vmgram_alt_info *local_58;
  size_t in_stack_ffffffffffffffb8;
  vmgram_alt_info *in_stack_ffffffffffffffc0;
  int *piVar9;
  CTcGramProdTok *local_30;
  
  pvVar6 = get_ext(in_RDI);
  sVar1 = pvVar6->alt_cnt_;
  for (local_30 = CTcGramProdAlt::get_tok_head(in_RDX); local_30 != (CTcGramProdTok *)0x0;
      local_30 = CTcGramProdTok::get_next(local_30)) {
  }
  piVar7 = (int *)operator_new(0x20);
  vmgram_alt_info::vmgram_alt_info(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  piVar7[3] = in_R8D;
  piVar9 = piVar7;
  iVar4 = CTcGramProdAlt::get_score(in_RDX);
  *piVar9 = iVar4;
  iVar4 = CTcGramProdAlt::get_badness(in_RDX);
  piVar9[1] = iVar4;
  local_58 = *(vmgram_alt_info **)(piVar9 + 4);
  for (local_30 = CTcGramProdAlt::get_tok_head(in_RDX);
      self_00 = (vm_obj_id_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
      local_30 != (CTcGramProdTok *)0x0; local_30 = CTcGramProdTok::get_next(local_30)) {
    tVar3 = CTcGramProdTok::get_prop_assoc(local_30);
    *(tctarg_prop_id_t *)&local_58->score = tVar3;
    tVar5 = CTcGramProdTok::get_type(local_30);
    in_stack_ffffffffffffff80 = (CVmUndo *)(ulong)tVar5;
    switch(in_stack_ffffffffffffff80) {
    case (CVmUndo *)0x0:
      *(undefined1 *)((long)&local_58->score + 2) = 0;
      break;
    case (CVmUndo *)0x1:
      *(undefined1 *)((long)&local_58->score + 2) = 1;
      this_00 = &CTcGramProdTok::getval_prod(local_30)->super_CTcSymObjBase;
      uVar8 = CTcSymObjBase::get_obj_id(this_00);
      local_58->del = (int)uVar8;
      break;
    case (CVmUndo *)0x2:
      *(undefined1 *)((long)&local_58->score + 2) = 2;
      tVar3 = CTcGramProdTok::getval_part_of_speech(local_30);
      *(tctarg_prop_id_t *)&local_58->del = tVar3;
      break;
    case (CVmUndo *)0x3:
      in_stack_ffffffffffffff70 = local_58;
      in_stack_ffffffffffffff78 = CTcGramProdTok::getval_literal_txt(local_30);
      CTcGramProdTok::getval_literal_len(local_30);
      vmgram_tok_info::set_literal
                ((vmgram_tok_info *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                 (size_t)in_stack_ffffffffffffff60);
      if ((in_ECX != 0) && (G_predef_X.misc_vocab != 0)) {
        vm_objp(0);
        CVmObjDict::add_word
                  ((CVmObjDict *)in_RDI,(vm_obj_id_t)((ulong)piVar7 >> 0x20),
                   (char *)in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
                   (vm_obj_id_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                   (vm_prop_id_t)((ulong)in_stack_ffffffffffffff70 >> 0x10));
      }
      break;
    case (CVmUndo *)0x4:
      *(undefined1 *)((long)&local_58->score + 2) = 4;
      uVar8 = CTcGramProdTok::getval_token_type(local_30);
      local_58->del = (int)uVar8;
      break;
    case (CVmUndo *)0x5:
      *(undefined1 *)((long)&local_58->score + 2) = 5;
      break;
    case (CVmUndo *)0x6:
      in_stack_ffffffffffffff68 = local_58;
      CTcGramProdTok::getval_part_list_len(local_30);
      vmgram_tok_info::set_nspeech(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      for (local_60 = 0; uVar2._0_4_ = local_58->del, uVar2._4_4_ = local_58->proc_obj,
          local_60 < uVar2; local_60 = local_60 + 1) {
        tVar3 = CTcGramProdTok::getval_part_list_ele(local_30,local_60);
        (&local_58->toks->prop)[local_60] = tVar3;
      }
    }
    local_58 = local_58 + 1;
  }
  insert_alt((CVmObjGramProd *)in_stack_ffffffffffffff80,self_00,(size_t)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  this_01 = (vmgram_undo_rec *)operator_new(0x10);
  vmgram_undo_rec::vmgram_undo_rec(this_01,3,(int)sVar1,(vmgram_alt_info *)0x0);
  this_02 = this_01;
  iVar4 = CVmUndo::add_new_record_ptr_key
                    (in_stack_ffffffffffffff80,self_00,in_stack_ffffffffffffff70);
  if ((iVar4 == 0) && (this_01 != (vmgram_undo_rec *)0x0)) {
    vmgram_undo_rec::~vmgram_undo_rec(this_02);
    operator_delete(this_01,0x10);
  }
  return;
}

Assistant:

void CVmObjGramProd::add_alt(VMG_ vm_obj_id_t self, CTcGramProdAlt *alt,
                             vm_obj_id_t dict, vm_obj_id_t match)
{
    /* add it at the last position */
    int idx = get_ext()->alt_cnt_;

    /* count the tokens in the rule */
    CTcGramProdTok *tok;
    int ntoks;
    for (ntoks = 0, tok = alt->get_tok_head() ; tok != 0 ;
         ++ntoks, tok = tok->get_next()) ;

    /* create our internal alt object */
    vmgram_alt_info *ai = new vmgram_alt_info(ntoks);

    /* set the attributes */
    ai->proc_obj = match;
    ai->score = alt->get_score();
    ai->badness = alt->get_badness();

    /* translate from the parsed token list to our internal token list */
    vmgram_tok_info *ti = ai->toks;
    for (tok = alt->get_tok_head() ; tok != 0 ; ++ti, tok = tok->get_next())
    {
        /* set the property association */
        ti->prop = tok->get_prop_assoc();

        /* set the type and type-specific data */
        switch (tok->get_type())
        {
        case TCGRAM_UNKNOWN:
            ti->typ = VMGRAM_MATCH_UNDEF;
            break;

        case TCGRAM_PROD:
            ti->typ = VMGRAM_MATCH_PROD;
            ti->typinfo.prod_obj = tok->getval_prod()->get_obj_id();
            break;

        case TCGRAM_PART_OF_SPEECH:
            ti->typ = VMGRAM_MATCH_SPEECH;
            ti->typinfo.speech_prop = tok->getval_part_of_speech();
            break;

        case TCGRAM_LITERAL:
            /* set the literal in our token structure */
            ti->set_literal(
                tok->getval_literal_txt(), tok->getval_literal_len());

            /* add the token to the dictionary */
            if (dict != VM_INVALID_OBJ
                && G_predef->misc_vocab != VM_INVALID_PROP)
            {
                ((CVmObjDict *)vm_objp(vmg_ dict))->add_word(
                    vmg_ dict, ti->typinfo.lit.str, ti->typinfo.lit.len,
                    self, G_predef->misc_vocab);
            }
            break;

        case TCGRAM_TOKEN_TYPE:
            ti->typ = VMGRAM_MATCH_TOKTYPE;
            ti->typinfo.toktyp_enum = tok->getval_token_type();
            break;

        case TCGRAM_STAR:
            ti->typ = VMGRAM_MATCH_STAR;
            break;

        case TCGRAM_PART_OF_SPEECH_LIST:
            ti->set_nspeech(tok->getval_part_list_len());
            for (size_t i = 0 ; i < ti->typinfo.nspeech.cnt ; ++i)
                ti->typinfo.nspeech.props[i] = tok->getval_part_list_ele(i);
            break;
        }
    }

    /* add it to the object */
    insert_alt(self, idx, ai);

    /* create and add an undo record */
    vmgram_undo_rec *rec = new vmgram_undo_rec(VMGRAM_UNDO_ADDED, idx, 0);
    if (!G_undo->add_new_record_ptr_key(vmg_ self, rec))
        delete rec;
}